

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockReturnValueTest_UnsignedLongIntegerReturnValueSetsDifferentValues_Test::
TEST_MockReturnValueTest_UnsignedLongIntegerReturnValueSetsDifferentValues_Test
          (TEST_MockReturnValueTest_UnsignedLongIntegerReturnValueSetsDifferentValues_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockReturnValueTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockReturnValueTest::TEST_GROUP_CppUTestGroupMockReturnValueTest
            (&this->super_TEST_GROUP_CppUTestGroupMockReturnValueTest);
  (this->super_TEST_GROUP_CppUTestGroupMockReturnValueTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002ccbd8;
  return;
}

Assistant:

TEST(MockReturnValueTest, UnsignedLongIntegerReturnValueSetsDifferentValues)
{
    unsigned long int expected_value = 1;
    unsigned long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedLongIntValue());
    LONGS_EQUAL(expected_value, mock().returnValue().getUnsignedLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getUnsignedLongIntValue());
    LONGS_EQUAL(another_expected_value, mock().returnValue().getUnsignedLongIntValue());
}